

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builder.h
# Opt level: O2

void __thiscall arangodb::velocypack::Builder::addInt(Builder *this,int64_t v)

{
  byte value;
  
  if ((ulong)v < 10) {
    value = (byte)v | 0x30;
  }
  else {
    if ((ulong)v < 0xfffffffffffffffa) {
      appendInt(this,v,'\x1f');
      return;
    }
    value = (byte)v + 0x40;
  }
  appendByte(this,value);
  return;
}

Assistant:

void addInt(int64_t v) {
    if (v >= 0 && v <= 9) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x30 + v));
    } else if (v < 0 && v >= -6) {
      // SmallInt
      appendByte(static_cast<uint8_t>(0x40 + v));
    } else {
      // regular int
      appendInt(v, 0x1f);
    }
  }